

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

sftp_zombie_requests * find_zombie_request(LIBSSH2_SFTP *sftp,uint32_t request_id)

{
  sftp_zombie_requests *local_20;
  sftp_zombie_requests *zombie;
  uint32_t request_id_local;
  LIBSSH2_SFTP *sftp_local;
  
  for (local_20 = (sftp_zombie_requests *)_libssh2_list_first(&sftp->zombie_requests);
      (local_20 != (sftp_zombie_requests *)0x0 && (local_20->request_id != request_id));
      local_20 = (sftp_zombie_requests *)_libssh2_list_next(&local_20->node)) {
  }
  return local_20;
}

Assistant:

static struct sftp_zombie_requests *
find_zombie_request(LIBSSH2_SFTP *sftp, uint32_t request_id)
{
    struct sftp_zombie_requests *zombie =
        _libssh2_list_first(&sftp->zombie_requests);

    while(zombie) {
        if(zombie->request_id == request_id)
            break;
        else
            zombie = _libssh2_list_next(&zombie->node);
    }

    return zombie;
}